

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

char * __thiscall
cmCommandArgumentParserHelper::CombineUnions
          (cmCommandArgumentParserHelper *this,char *in1,char *in2)

{
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  char *out;
  char *local_30;
  
  local_30 = in2;
  if ((in1 != (char *)0x0) && (local_30 = in1, in2 != (char *)0x0)) {
    sVar1 = strlen(in1);
    sVar2 = strlen(in2);
    __dest = (char *)operator_new__(sVar1 + sVar2 + 1);
    local_30 = __dest;
    strcpy(__dest,in1);
    strcat(__dest,in2);
    std::vector<char_*,_std::allocator<char_*>_>::push_back(&this->Variables,&local_30);
  }
  return local_30;
}

Assistant:

const char* cmCommandArgumentParserHelper::CombineUnions(const char* in1,
                                                         const char* in2)
{
  if (!in1) {
    return in2;
  }
  if (!in2) {
    return in1;
  }
  size_t len = strlen(in1) + strlen(in2) + 1;
  char* out = new char[len];
  strcpy(out, in1);
  strcat(out, in2);
  this->Variables.push_back(out);
  return out;
}